

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acquisition.c
# Opt level: O0

int katherine_acquisition_begin
              (katherine_acquisition_t *acq,katherine_config_t *config,char readout_mode,
              katherine_acquisition_mode_t acq_mode,_Bool fast_vco_enabled,_Bool decode_data)

{
  time_t tVar1;
  int local_30;
  int res;
  _Bool decode_data_local;
  _Bool fast_vco_enabled_local;
  katherine_acquisition_mode_t acq_mode_local;
  char readout_mode_local;
  katherine_config_t *config_local;
  katherine_acquisition_t *acq_local;
  
  acq->acq_mode = (char)acq_mode;
  acq->readout_mode = readout_mode;
  acq->fast_vco_enabled = fast_vco_enabled;
  acq->decode_data = decode_data;
  if ((readout_mode == '\x01') && (1 < config->no_frames)) {
    local_30 = 0x16;
  }
  else {
    local_30 = katherine_configure(acq->device,config);
    if ((local_30 == 0) &&
       ((local_30 = katherine_set_seq_readout_start(acq->device,(int)readout_mode), local_30 == 0 &&
        (local_30 = katherine_set_acq_mode(acq->device,acq_mode,fast_vco_enabled), local_30 == 0))))
    {
      acq->state = '\x01';
      acq->completed_frames = 0;
      acq->requested_frames = config->no_frames;
      acq->requested_frame_duration = config->acq_time / 1000000000.0;
      acq->dropped_measurement_data = 0;
      acq->pixel_buffer_valid = 0;
      acq->pixel_buffer_max_valid = 0;
      acq->last_toa_offset = 0;
      local_30 = katherine_udp_mutex_lock(&acq->device->control_socket);
      if (local_30 == 0) {
        tVar1 = time((time_t *)0x0);
        acq->acq_start_time = tVar1;
        local_30 = katherine_cmd_start_acquisition(&acq->device->control_socket,readout_mode);
        if (local_30 == 0) {
          katherine_udp_mutex_unlock(&acq->device->control_socket);
          return 0;
        }
        katherine_udp_mutex_unlock(&acq->device->control_socket);
      }
    }
  }
  return local_30;
}

Assistant:

int
katherine_acquisition_begin(katherine_acquisition_t *acq, const katherine_config_t *config, char readout_mode, katherine_acquisition_mode_t acq_mode, bool fast_vco_enabled, bool decode_data)
{
    int res = 0;

    acq->acq_mode = acq_mode;
    acq->readout_mode = readout_mode;
    acq->fast_vco_enabled = fast_vco_enabled;
    acq->decode_data = decode_data;

#if KATHERINE_DEBUG_ACQ > 0
    dump_config(acq, config);
#endif /* KATHERINE_DEBUG_ACQ */

    if (readout_mode == READOUT_DATA_DRIVEN && config->no_frames > 1) {
        res = EINVAL;
        goto err;
    }

    res = katherine_configure(acq->device, config);
    if (res) goto err;

    res = katherine_set_seq_readout_start(acq->device, readout_mode);
    if (res) goto err;

    res = katherine_set_acq_mode(acq->device, acq_mode, fast_vco_enabled);
    if (res) goto err;

    acq->state = ACQUISITION_RUNNING;

    acq->completed_frames = 0;
    acq->requested_frames = config->no_frames;
    acq->requested_frame_duration = config->acq_time / 1e9;
    acq->dropped_measurement_data = 0;

    acq->pixel_buffer_valid = 0;
    acq->pixel_buffer_max_valid = 0;
    acq->last_toa_offset = 0;

    res = katherine_udp_mutex_lock(&acq->device->control_socket);
    if (res) goto err;

    acq->acq_start_time = time(NULL);

    res = katherine_cmd_start_acquisition(&acq->device->control_socket, readout_mode);
    if (res) goto err_cmd;

    (void) katherine_udp_mutex_unlock(&acq->device->control_socket);
    return 0;

err_cmd:
    (void) katherine_udp_mutex_unlock(&acq->device->control_socket);
err:
    return res;
}